

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_charset.hpp
# Opt level: O2

void __thiscall
boost::xpressive::detail::char_overflow_handler::operator()
          (char_overflow_handler *this,range_check_result result)

{
  source_location local_60;
  regex_error local_48;
  
  if (result == cInRange) {
    return;
  }
  regex_error::regex_error
            (&local_48,error_escape,"character escape too large to fit in target character type");
  local_60.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/detail/dynamic/parse_charset.hpp"
  ;
  local_60.function_ =
       "void boost::xpressive::detail::char_overflow_handler::operator()(numeric::range_check_result) const"
  ;
  local_60.line_ = 0x3f;
  local_60.column_ = 0;
  throw_exception<boost::xpressive::regex_error>(&local_48,&local_60);
}

Assistant:

void operator ()(numeric::range_check_result result) const // throw(regex_error)
    {
        if(numeric::cInRange != result)
        {
            BOOST_THROW_EXCEPTION(
                regex_error(
                    regex_constants::error_escape
                  , "character escape too large to fit in target character type"
                )
            );
        }
    }